

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ConstraintsGroup.cpp
# Opt level: O2

bool __thiscall
iDynTree::optimalcontrol::ConstraintsGroup::removeConstraint(ConstraintsGroup *this,string *name)

{
  ConstraintsGroupPimpl *pCVar1;
  pointer psVar2;
  pointer psVar3;
  long lVar4;
  __type _Var5;
  size_type sVar6;
  string *__lhs;
  ulong uVar7;
  ostream *poVar8;
  bool bVar9;
  __normal_iterator<std::shared_ptr<iDynTree::optimalcontrol::TimedConstraint>_*,_std::vector<std::shared_ptr<iDynTree::optimalcontrol::TimedConstraint>,_std::allocator<std::shared_ptr<iDynTree::optimalcontrol::TimedConstraint>_>_>_>
  __i;
  pointer psVar10;
  const_iterator __position;
  ostringstream errorMsg;
  char *local_1c0 [4];
  ostringstream local_1a0 [376];
  
  sVar6 = std::
          _Hashtable<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::shared_ptr<iDynTree::optimalcontrol::TimedConstraint>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::shared_ptr<iDynTree::optimalcontrol::TimedConstraint>_>_>,_std::__detail::_Select1st,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>_>
          ::_M_erase((_Hashtable<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::shared_ptr<iDynTree::optimalcontrol::TimedConstraint>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::shared_ptr<iDynTree::optimalcontrol::TimedConstraint>_>_>,_std::__detail::_Select1st,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>_>
                      *)this->m_pimpl);
  if (sVar6 == 0) {
    std::__cxx11::ostringstream::ostringstream(local_1a0);
    poVar8 = std::operator<<((ostream *)local_1a0,"Unable to find constraint named ");
    poVar8 = std::operator<<(poVar8,(string *)name);
    std::endl<char,std::char_traits<char>>(poVar8);
    std::__cxx11::stringbuf::str();
    iDynTree::reportError("ConstraintsGroup","removeConstraint",local_1c0[0]);
LAB_001aa5bd:
    std::__cxx11::string::~string((string *)local_1c0);
    std::__cxx11::ostringstream::~ostringstream(local_1a0);
    bVar9 = false;
  }
  else {
    __position._M_current =
         (this->m_pimpl->orderedIntervals).
         super__Vector_base<std::shared_ptr<iDynTree::optimalcontrol::TimedConstraint>,_std::allocator<std::shared_ptr<iDynTree::optimalcontrol::TimedConstraint>_>_>
         ._M_impl.super__Vector_impl_data._M_start;
    _Var5 = false;
    while (pCVar1 = this->m_pimpl, _Var5 == false) {
      if (__position._M_current ==
          (pCVar1->orderedIntervals).
          super__Vector_base<std::shared_ptr<iDynTree::optimalcontrol::TimedConstraint>,_std::allocator<std::shared_ptr<iDynTree::optimalcontrol::TimedConstraint>_>_>
          ._M_impl.super__Vector_impl_data._M_finish) {
        std::__cxx11::ostringstream::ostringstream(local_1a0);
        poVar8 = std::operator<<((ostream *)local_1a0,"Unable to find constraint named ");
        poVar8 = std::operator<<(poVar8,(string *)name);
        poVar8 = std::operator<<(poVar8,"on the ordered vector. This is most likely a bug.");
        std::endl<char,std::char_traits<char>>(poVar8);
        std::__cxx11::stringbuf::str();
        iDynTree::reportError("ConstraintsGroup","removeConstraint",local_1c0[0]);
        goto LAB_001aa5bd;
      }
      __lhs = Constraint::name_abi_cxx11_
                        (((((__position._M_current)->
                           super___shared_ptr<iDynTree::optimalcontrol::TimedConstraint,_(__gnu_cxx::_Lock_policy)2>
                           )._M_ptr)->constraint).
                         super___shared_ptr<iDynTree::optimalcontrol::Constraint,_(__gnu_cxx::_Lock_policy)2>
                         ._M_ptr);
      _Var5 = std::operator==(__lhs,name);
      if (_Var5) {
        std::
        vector<std::shared_ptr<iDynTree::optimalcontrol::TimedConstraint>,_std::allocator<std::shared_ptr<iDynTree::optimalcontrol::TimedConstraint>_>_>
        ::erase(&this->m_pimpl->orderedIntervals,__position);
      }
      else {
        __position._M_current = __position._M_current + 1;
      }
    }
    psVar2 = (pCVar1->orderedIntervals).
             super__Vector_base<std::shared_ptr<iDynTree::optimalcontrol::TimedConstraint>,_std::allocator<std::shared_ptr<iDynTree::optimalcontrol::TimedConstraint>_>_>
             ._M_impl.super__Vector_impl_data._M_start;
    psVar3 = (pCVar1->orderedIntervals).
             super__Vector_base<std::shared_ptr<iDynTree::optimalcontrol::TimedConstraint>,_std::allocator<std::shared_ptr<iDynTree::optimalcontrol::TimedConstraint>_>_>
             ._M_impl.super__Vector_impl_data._M_finish;
    bVar9 = true;
    if (psVar2 != psVar3) {
      uVar7 = (long)psVar3 - (long)psVar2 >> 4;
      lVar4 = 0x3f;
      if (uVar7 != 0) {
        for (; uVar7 >> lVar4 == 0; lVar4 = lVar4 + -1) {
        }
      }
      std::
      __introsort_loop<__gnu_cxx::__normal_iterator<std::shared_ptr<iDynTree::optimalcontrol::TimedConstraint>*,std::vector<std::shared_ptr<iDynTree::optimalcontrol::TimedConstraint>,std::allocator<std::shared_ptr<iDynTree::optimalcontrol::TimedConstraint>>>>,long,__gnu_cxx::__ops::_Iter_comp_iter<iDynTree::optimalcontrol::ConstraintsGroup::removeConstraint(std::__cxx11::string_const&)::__0>>
                (psVar2,psVar3,((uint)lVar4 ^ 0x3f) * 2 ^ 0x7e);
      if ((long)psVar3 - (long)psVar2 < 0x101) {
        std::
        __insertion_sort<__gnu_cxx::__normal_iterator<std::shared_ptr<iDynTree::optimalcontrol::TimedConstraint>*,std::vector<std::shared_ptr<iDynTree::optimalcontrol::TimedConstraint>,std::allocator<std::shared_ptr<iDynTree::optimalcontrol::TimedConstraint>>>>,__gnu_cxx::__ops::_Iter_comp_iter<iDynTree::optimalcontrol::ConstraintsGroup::removeConstraint(std::__cxx11::string_const&)::__0>>
                  (psVar2,psVar3);
      }
      else {
        psVar10 = psVar2 + 0x10;
        std::
        __insertion_sort<__gnu_cxx::__normal_iterator<std::shared_ptr<iDynTree::optimalcontrol::TimedConstraint>*,std::vector<std::shared_ptr<iDynTree::optimalcontrol::TimedConstraint>,std::allocator<std::shared_ptr<iDynTree::optimalcontrol::TimedConstraint>>>>,__gnu_cxx::__ops::_Iter_comp_iter<iDynTree::optimalcontrol::ConstraintsGroup::removeConstraint(std::__cxx11::string_const&)::__0>>
                  (psVar2,psVar10);
        for (; psVar10 != psVar3; psVar10 = psVar10 + 1) {
          std::
          __unguarded_linear_insert<__gnu_cxx::__normal_iterator<std::shared_ptr<iDynTree::optimalcontrol::TimedConstraint>*,std::vector<std::shared_ptr<iDynTree::optimalcontrol::TimedConstraint>,std::allocator<std::shared_ptr<iDynTree::optimalcontrol::TimedConstraint>>>>,__gnu_cxx::__ops::_Val_comp_iter<iDynTree::optimalcontrol::ConstraintsGroup::removeConstraint(std::__cxx11::string_const&)::__0>>
                    (psVar10);
        }
      }
    }
  }
  return bVar9;
}

Assistant:

bool ConstraintsGroup::removeConstraint(const std::string& name)
        {
            if (!(m_pimpl->group.erase(name))) {
                std::ostringstream errorMsg;
                errorMsg << "Unable to find constraint named "<<name<< std::endl;
                reportError("ConstraintsGroup", "removeConstraint", errorMsg.str().c_str());
                return false;
            }

            bool found = false;
            std::vector<TimedConstraint_ptr>::iterator it = m_pimpl->orderedIntervals.begin();
            while ((!found) && (it != m_pimpl->orderedIntervals.end())){
                if (it->get()->constraint->name() == name) {
                    m_pimpl->orderedIntervals.erase(it);
                    found = true;
                } else {
                    ++it;
                }
            }

            if (!found) {
                std::ostringstream errorMsg;
                errorMsg << "Unable to find constraint named "<<name<< "on the ordered vector. This is most likely a bug." << std::endl;
                reportError("ConstraintsGroup", "removeConstraint", errorMsg.str().c_str());
                return false;
            }

            std::sort(m_pimpl->orderedIntervals.begin(), m_pimpl->orderedIntervals.end(), [](const TimedConstraint_ptr&a, const TimedConstraint_ptr&b) { return a->timeRange < b->timeRange;}); //reorder the vector
            return true;
        }